

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_pack8to1.h
# Opt level: O0

void ncnn::deformableconv2d_pack8to1_avx
               (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,Mat *top_blob,
               Mat *weight_data_packed,Mat *bias_data,int kernel_w,int kernel_h,int dilation_w,
               int dilation_h,int stride_w,int stride_h,int pad_left,int pad_top,int activation_type
               ,Mat *activation_params,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  size_type sVar6;
  const_reference pvVar7;
  float *pfVar8;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar9;
  float fVar10;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  undefined4 in_stack_00000038;
  long *in_stack_00000040;
  float _conv_w7;
  float _conv_w6;
  float _conv_w5;
  float _conv_w4;
  float _conv_w3;
  float _conv_w2;
  float _conv_w1;
  float _conv_w0;
  float _v4_channel7;
  float _v4_channel6;
  float _v4_channel5;
  float _v4_channel4;
  float _v4_channel3;
  float _v4_channel2;
  float _v4_channel1;
  float _v4_channel0;
  float _v3_channel7;
  float _v3_channel6;
  float _v3_channel5;
  float _v3_channel4;
  float _v3_channel3;
  float _v3_channel2;
  float _v3_channel1;
  float _v3_channel0;
  float _v2_channel7;
  float _v2_channel6;
  float _v2_channel5;
  float _v2_channel4;
  float _v2_channel3;
  float _v2_channel2;
  float _v2_channel1;
  float _v2_channel0;
  float _v1_channel7;
  float _v1_channel6;
  float _v1_channel5;
  float _v1_channel4;
  float _v1_channel3;
  float _v1_channel2;
  float _v1_channel1;
  float _v1_channel0;
  float _val_channel7;
  float _val_channel6;
  float _val_channel5;
  float _val_channel4;
  float _val_channel3;
  float _val_channel2;
  float _val_channel1;
  float _val_channel0;
  float *data_im_ptr;
  int ic;
  float hw;
  float hh;
  float lw;
  float lh;
  int w_high;
  int h_high;
  int w_low;
  int h_low;
  int v4_pos;
  int v3_pos;
  int v2_pos;
  int v1_pos;
  bool v4_cond;
  bool v3_cond;
  bool v2_cond;
  bool v1_cond;
  float w4;
  float w3;
  float w2;
  float w1;
  bool cond;
  float w_im;
  float h_im;
  int m_c;
  Mat *mask;
  int x_c;
  int y_c;
  float mask_;
  float offset_w;
  float offset_h;
  int j;
  int i;
  float _sum;
  float *outptr;
  float *kptr;
  int oc;
  int w_in;
  int h_in;
  int w_col;
  int h_col;
  int wstep;
  int out_elempack;
  int elempack;
  float *bias_data_ptr;
  int maxk;
  int size;
  int outch;
  int outh;
  int outw;
  int inch;
  int h;
  int w;
  bool mask_not_pack;
  bool offset_not_pack;
  bool has_mask;
  Mat *offset;
  Mat *bottom_blob;
  Mat *m_1;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  float local_cd4;
  bool local_c9d;
  bool local_c9c;
  bool local_c9b;
  bool local_c9a;
  bool local_c99;
  bool local_b69;
  float local_b48;
  float local_b44;
  float local_b40;
  float local_b3c;
  float local_b38;
  float local_b34;
  float local_b30;
  float local_b2c;
  float local_b28;
  float local_b24;
  float local_b20;
  float local_b1c;
  float local_b18;
  float local_b14;
  float local_b10;
  float local_b0c;
  float local_b08;
  float local_b04;
  float local_b00;
  float local_afc;
  float local_af8;
  float local_af4;
  float local_af0;
  float local_aec;
  float local_ae8;
  float local_ae4;
  float local_ae0;
  float local_adc;
  float local_ad8;
  float local_ad4;
  float local_ad0;
  float local_acc;
  float local_ac8;
  float local_ac4;
  float local_ac0;
  float local_abc;
  float local_ab8;
  float local_ab4;
  float local_ab0;
  float local_aac;
  undefined8 local_aa8;
  undefined8 local_aa0;
  undefined8 local_a98;
  undefined4 local_a90;
  Allocator *local_a88;
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined8 local_a68;
  void *local_a60;
  int local_a54;
  float local_a50;
  float local_a4c;
  float local_a48;
  float local_a44;
  int local_a40;
  int local_a3c;
  int local_a38;
  int local_a34;
  int local_a30;
  int local_a2c;
  int local_a28;
  int local_a24;
  bool local_a20;
  bool local_a1f;
  bool local_a1e;
  bool local_a1d;
  float local_a1c;
  float local_a18;
  float local_a14;
  float local_a10;
  bool local_a09;
  float local_a08;
  float local_a04;
  undefined8 local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined4 local_9e8;
  Allocator *local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined8 local_9c0;
  int local_9b4;
  undefined8 local_9b0;
  undefined8 local_9a8;
  undefined8 local_9a0;
  undefined4 local_998;
  Allocator *local_990;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined8 local_970;
  const_reference local_968;
  undefined8 local_960;
  undefined8 local_958;
  undefined8 local_950;
  undefined4 local_948;
  Allocator *local_940;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined8 local_910;
  undefined8 local_908;
  undefined4 local_900;
  Allocator *local_8f8;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined8 local_8d8;
  int local_8d0;
  int local_8cc;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined4 local_8b0;
  Allocator *local_8a8;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  undefined4 local_890;
  undefined8 local_888;
  undefined8 local_880;
  undefined8 local_878;
  undefined8 local_870;
  undefined4 local_868;
  Allocator *local_860;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined8 local_840;
  float local_838;
  float local_834;
  float local_830;
  int local_82c;
  int local_828;
  float local_824;
  undefined8 local_820;
  undefined8 local_818;
  undefined8 local_810;
  undefined4 local_808;
  long local_800;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined8 local_7e0;
  long local_7d8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined4 local_7a8;
  long local_7a0;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined4 local_78c;
  undefined4 local_788;
  undefined8 local_780;
  float *local_778;
  int local_770;
  int local_76c;
  int local_768;
  int local_764;
  int local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined4 local_754;
  long local_750;
  int local_744;
  int local_740;
  int local_73c;
  int local_738;
  int local_734;
  int local_730;
  int local_72c;
  int local_728;
  bool local_723;
  byte local_722;
  byte local_721;
  const_reference local_720;
  const_reference local_718;
  int local_710;
  int local_70c;
  long *local_708;
  long *local_700;
  long *local_6f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_6f0;
  undefined1 local_6e5;
  int local_6e4;
  undefined8 *local_6d8;
  undefined8 *local_6c8;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 *local_658;
  undefined8 *local_648;
  undefined8 *local_638;
  undefined8 *local_628;
  undefined8 *local_618;
  undefined8 *local_608;
  undefined8 *local_5f8;
  undefined8 *local_5e8;
  undefined8 *local_5c8;
  undefined1 local_5ad;
  int local_5ac;
  const_reference local_5a8;
  undefined8 *local_5a0;
  undefined1 local_57d;
  int local_57c;
  const_reference local_578;
  undefined8 *local_570;
  undefined1 local_54d;
  int local_54c;
  const_reference local_548;
  undefined8 *local_540;
  undefined1 local_51d;
  int local_51c;
  const_reference local_518;
  undefined8 *local_510;
  undefined1 local_4ed;
  int local_4ec;
  const_reference local_4e8;
  undefined8 *local_4e0;
  undefined1 local_4bd;
  int local_4bc;
  const_reference local_4b8;
  undefined8 *local_4b0;
  undefined1 local_48d;
  int local_48c;
  const_reference local_488;
  undefined8 *local_480;
  undefined1 local_45d;
  int local_45c;
  undefined8 *local_450;
  int local_42c;
  undefined8 *local_428;
  int local_41c;
  undefined8 *local_418;
  int local_40c;
  undefined8 *local_408;
  int local_3fc;
  undefined8 *local_3f8;
  int local_3ec;
  undefined8 *local_3e8;
  int local_3dc;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  long *local_3c0;
  float local_3b4;
  float local_3b0;
  float local_3ac;
  float local_3a8;
  float local_3a4;
  float local_3a0;
  float local_39c;
  float local_398;
  float local_394;
  long *local_390;
  float local_384 [3];
  long *local_378;
  undefined8 local_370;
  long *local_368;
  undefined8 local_360;
  long *local_358;
  undefined8 local_350;
  long *local_348;
  undefined8 local_340;
  long *local_338;
  long local_330;
  undefined4 local_324;
  long local_320;
  float *local_318;
  undefined4 local_30c;
  int local_308;
  int local_304;
  undefined8 *local_300;
  Allocator *local_2f8;
  int local_2ec;
  size_t local_2e8;
  void *local_2e0;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  undefined8 *local_2c8;
  Allocator *local_2c0;
  int local_2b4;
  size_t local_2b0;
  void *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  undefined8 *local_290;
  Allocator *local_288;
  int local_27c;
  size_t local_278;
  void *local_270;
  int local_264;
  int local_260;
  int local_25c;
  undefined8 *local_258;
  Allocator *local_250;
  int local_244;
  size_t local_240;
  void *local_238;
  int local_22c;
  int local_228;
  int local_224;
  undefined8 *local_220;
  Allocator *local_218;
  int local_20c;
  size_t local_208;
  void *local_200;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  undefined8 *local_1e8;
  Allocator *local_1e0;
  int local_1d4;
  size_t local_1d0;
  void *local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  undefined8 *local_1b0;
  Allocator *local_1a8;
  int local_19c;
  size_t local_198;
  void *local_190;
  int local_184;
  int local_180;
  int local_17c;
  undefined8 *local_178;
  long local_170;
  undefined4 local_164;
  long local_160;
  long local_158;
  undefined4 local_14c;
  int local_148;
  int local_144;
  undefined8 *local_140;
  undefined4 local_134;
  long local_130;
  undefined4 local_124;
  long local_120;
  undefined4 local_114;
  long local_110;
  undefined4 local_104;
  long local_100;
  undefined4 local_f4;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  undefined4 local_c4;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  undefined8 *local_a8;
  
  local_710 = in_R9D;
  local_70c = in_R8D;
  local_708 = in_RCX;
  local_700 = in_RDX;
  local_6f8 = in_RSI;
  local_6f0 = in_RDI;
  local_718 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDI,0);
  local_720 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_6f0,1);
  sVar6 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_6f0);
  local_721 = sVar6 == 3;
  local_722 = local_720->elempack == 1;
  if ((bool)local_721) {
    pvVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_6f0,2);
    local_b69 = pvVar7->elempack == 1;
  }
  else {
    local_b69 = true;
  }
  local_723 = local_b69;
  local_728 = local_718->w;
  local_72c = local_718->h;
  local_730 = local_718->c;
  local_734 = *(int *)((long)local_6f8 + 0x2c);
  local_738 = (int)local_6f8[6];
  local_73c = (int)local_6f8[7];
  local_740 = local_734 * local_738;
  local_744 = local_70c * local_710;
  local_3c0 = local_708;
  local_750 = *local_708;
  local_754 = 8;
  local_758 = 1;
  local_75c = 8;
  for (local_760 = 0; local_760 < local_738; local_760 = local_760 + 1) {
    for (local_764 = 0; local_764 < local_734; local_764 = local_764 + 1) {
      local_768 = local_760 * in_stack_00000020 - in_stack_00000030;
      local_76c = local_764 * in_stack_00000018 - in_stack_00000028;
      for (local_770 = 0; local_770 < local_73c; local_770 = local_770 + 1) {
        local_450 = &local_7c0;
        local_304 = *(int *)((long)local_700 + 0x2c);
        local_308 = (int)local_700[6];
        local_30c = *(undefined4 *)((long)local_700 + 0x34);
        local_778 = (float *)(*local_700 + local_700[8] * (long)local_770 * local_700[2]);
        local_320 = local_700[2];
        local_324 = (undefined4)local_700[3];
        local_330 = local_700[4];
        local_300 = &local_7c0;
        local_b0 = (long)local_304 * (long)local_308 * local_320;
        local_3c8 = &local_7c0;
        local_6c8 = &local_7c0;
        local_6d8 = &local_820;
        local_144 = *(int *)((long)local_6f8 + 0x2c);
        local_148 = (int)local_6f8[6];
        local_14c = *(undefined4 *)((long)local_6f8 + 0x34);
        local_7d8 = *local_6f8 + local_6f8[8] * (long)local_770 * local_6f8[2];
        local_160 = local_6f8[2];
        local_164 = (undefined4)local_6f8[3];
        local_170 = local_6f8[4];
        local_140 = &local_820;
        local_130 = (long)local_144 * (long)local_148 * local_160;
        local_a8 = &local_820;
        local_6b8 = &local_820;
        local_788 = 0;
        local_78c = 0;
        local_790 = 0;
        local_794 = 0;
        local_7a8 = 0;
        local_7b0 = 0;
        local_7b8 = 0;
        local_7c0 = 0;
        local_b4 = 0x10;
        local_134 = 0x10;
        local_45c = local_770;
        local_45d = 1;
        local_6e4 = local_770;
        local_6e5 = 1;
        local_780 = 0;
        local_798 = 0;
        local_820 = 0;
        local_810 = 0;
        local_808 = 0;
        local_7f8 = 0;
        local_7f4 = 0;
        local_7f0 = 0;
        local_7ec = 0;
        local_7e8 = 0;
        local_7e0 = 0;
        local_818 = 0;
        local_824 = 0.0;
        if (local_750 != 0) {
          local_824 = *(float *)(local_750 + (long)local_770 * 4);
        }
        local_5e8 = local_6b8;
        local_5c8 = local_6c8;
        local_318 = local_778;
        local_158 = local_7d8;
        local_800 = local_170;
        local_7a0 = local_330;
        for (local_828 = 0; fVar9 = local_824, local_828 < local_710; local_828 = local_828 + 1) {
          for (local_82c = 0; local_82c < local_70c; local_82c = local_82c + 1) {
            if ((local_722 & 1) == 0) {
              local_8cc = (local_828 * local_70c + local_82c) * 2;
              local_8d0 = (local_828 * local_70c + local_82c) * 2 + 1;
              local_4ec = local_8cc / local_720->elempack;
              local_4e0 = &local_918;
              local_25c = local_720->w;
              local_260 = local_720->h;
              local_264 = local_720->d;
              local_270 = (void *)((long)local_720->data +
                                  local_720->cstep * (long)local_4ec * local_720->elemsize);
              local_278 = local_720->elemsize;
              local_27c = local_720->elempack;
              local_288 = local_720->allocator;
              local_258 = &local_918;
              local_e0 = (long)local_25c * (long)local_260 * local_278;
              local_3f8 = &local_918;
              local_830 = *(float *)((long)local_270 +
                                    (long)(local_764 * local_720->elempack +
                                          local_8cc % local_720->elempack) * 4 +
                                    (long)local_25c * (long)local_760 * local_278);
              local_6a0 = &local_918;
              local_51c = local_8d0 / local_720->elempack;
              local_510 = &local_960;
              local_224 = local_720->w;
              local_228 = local_720->h;
              local_22c = local_720->d;
              local_238 = (void *)((long)local_720->data +
                                  local_720->cstep * (long)local_51c * local_720->elemsize);
              local_240 = local_720->elemsize;
              local_244 = local_720->elempack;
              local_250 = local_720->allocator;
              local_220 = &local_960;
              local_f0 = (long)local_224 * (long)local_228 * local_240;
              local_408 = &local_960;
              local_834 = *(float *)((long)local_238 +
                                    (long)(local_764 * local_720->elempack +
                                          local_8d0 % local_720->elempack) * 4 +
                                    (long)local_224 * (long)local_760 * local_240);
              local_698 = &local_960;
              local_8e0 = 0;
              local_8e4 = 0;
              local_8e8 = 0;
              local_8ec = 0;
              local_900 = 0;
              local_908 = 0;
              local_910 = 0;
              local_918 = 0;
              local_e4 = 0x10;
              local_f4 = 0x10;
              local_3fc = local_760;
              local_40c = local_760;
              local_4e8 = local_720;
              local_4ed = 1;
              local_518 = local_720;
              local_51d = 1;
              local_8d8 = 0;
              local_8f0 = 0;
              local_960 = 0;
              local_950 = 0;
              local_948 = 0;
              local_938 = 0;
              local_934 = 0;
              local_930 = 0;
              local_92c = 0;
              local_928 = 0;
              local_920 = 0;
              local_958 = 0;
              local_628 = local_698;
              local_618 = local_6a0;
              local_940 = local_250;
              local_8f8 = local_288;
            }
            else {
              local_48c = (local_828 * local_70c + local_82c) * 2;
              local_480 = &local_880;
              local_2cc = local_720->w;
              local_2d0 = local_720->h;
              local_2d4 = local_720->d;
              local_2e0 = (void *)((long)local_720->data +
                                  local_720->cstep * (long)local_48c * local_720->elemsize);
              local_2e8 = local_720->elemsize;
              local_2ec = local_720->elempack;
              local_2f8 = local_720->allocator;
              local_2c8 = &local_880;
              local_c0 = (long)local_2cc * (long)local_2d0 * local_2e8;
              local_3d8 = &local_880;
              local_830 = *(float *)((long)local_2e0 +
                                    (long)local_764 * 4 +
                                    (long)local_2cc * (long)local_760 * local_2e8);
              local_6b0 = &local_880;
              local_4bc = (local_828 * local_70c + local_82c) * 2 + 1;
              local_4b0 = &local_8c8;
              local_294 = local_720->w;
              local_298 = local_720->h;
              local_29c = local_720->d;
              local_2a8 = (void *)((long)local_720->data +
                                  local_720->cstep * (long)local_4bc * local_720->elemsize);
              local_2b0 = local_720->elemsize;
              local_2b4 = local_720->elempack;
              local_2c0 = local_720->allocator;
              local_290 = &local_8c8;
              local_d0 = (long)local_294 * (long)local_298 * local_2b0;
              local_3e8 = &local_8c8;
              local_834 = *(float *)((long)local_2a8 +
                                    (long)local_764 * 4 +
                                    (long)local_294 * (long)local_760 * local_2b0);
              local_6a8 = &local_8c8;
              local_848 = 0;
              local_84c = 0;
              local_850 = 0;
              local_854 = 0;
              local_868 = 0;
              local_870 = 0;
              local_878 = 0;
              local_880 = 0;
              local_c4 = 0x10;
              local_d4 = 0x10;
              local_3dc = local_760;
              local_3ec = local_760;
              local_488 = local_720;
              local_48d = 1;
              local_4b8 = local_720;
              local_4bd = 1;
              local_840 = 0;
              local_858 = 0;
              local_8c8 = 0;
              local_8b8 = 0;
              local_8b0 = 0;
              local_8a0 = 0;
              local_89c = 0;
              local_898 = 0;
              local_894 = 0;
              local_890 = 0;
              local_888 = 0;
              local_8c0 = 0;
              local_608 = local_6a8;
              local_5f8 = local_6b0;
              local_8a8 = local_2c0;
              local_860 = local_2f8;
            }
            local_838 = 1.0;
            if ((local_721 & 1) != 0) {
              local_968 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                    (local_6f0,2);
              if ((local_723 & 1U) == 0) {
                local_9b4 = local_828 * local_70c + local_82c;
                local_57c = local_9b4 / local_968->elempack;
                local_570 = &local_a00;
                local_1b4 = local_968->w;
                local_1b8 = local_968->h;
                local_1bc = local_968->d;
                local_1c8 = (void *)((long)local_968->data +
                                    local_968->cstep * (long)local_57c * local_968->elemsize);
                local_1d0 = local_968->elemsize;
                local_1d4 = local_968->elempack;
                local_1e0 = local_968->allocator;
                local_1b0 = &local_a00;
                local_110 = (long)local_1b4 * (long)local_1b8 * local_1d0;
                local_428 = &local_a00;
                local_838 = *(float *)((long)local_1c8 +
                                      (long)(local_764 * local_968->elempack +
                                            local_9b4 % local_968->elempack) * 4 +
                                      (long)local_1b4 * (long)local_760 * local_1d0);
                local_688 = &local_a00;
                local_114 = 0x10;
                local_42c = local_760;
                local_57d = 1;
                local_a00 = 0;
                local_9f0 = 0;
                local_9e8 = 0;
                local_9d8 = 0;
                local_9d4 = 0;
                local_9d0 = 0;
                local_9cc = 0;
                local_9c8 = 0;
                local_9c0 = 0;
                local_9f8 = 0;
                local_648 = local_688;
                local_578 = local_968;
                local_9e0 = local_1e0;
              }
              else {
                local_54c = local_828 * local_70c + local_82c;
                local_540 = &local_9b0;
                local_1ec = local_968->w;
                local_1f0 = local_968->h;
                local_1f4 = local_968->d;
                local_200 = (void *)((long)local_968->data +
                                    local_968->cstep * (long)local_54c * local_968->elemsize);
                local_208 = local_968->elemsize;
                local_20c = local_968->elempack;
                local_218 = local_968->allocator;
                local_1e8 = &local_9b0;
                local_100 = (long)local_1ec * (long)local_1f0 * local_208;
                local_418 = &local_9b0;
                local_838 = *(float *)((long)local_200 +
                                      (long)local_764 * 4 +
                                      (long)local_1ec * (long)local_760 * local_208);
                local_690 = &local_9b0;
                local_104 = 0x10;
                local_41c = local_760;
                local_54d = 1;
                local_9b0 = 0;
                local_9a0 = 0;
                local_998 = 0;
                local_988 = 0;
                local_984 = 0;
                local_980 = 0;
                local_97c = 0;
                local_978 = 0;
                local_970 = 0;
                local_9a8 = 0;
                local_638 = local_690;
                local_548 = local_968;
                local_990 = local_218;
              }
            }
            local_a04 = (float)(local_768 + local_828 * in_stack_00000010) + local_830;
            local_a08 = (float)(local_76c + local_82c * in_stack_00000008) + local_834;
            local_c99 = false;
            if (((-1.0 < local_a04) && (local_c99 = false, -1.0 < local_a08)) &&
               (local_c99 = false, local_a04 < (float)local_72c)) {
              local_c99 = local_a08 < (float)local_728;
            }
            local_a09 = local_c99;
            local_a10 = 0.0;
            local_a14 = 0.0;
            local_a18 = 0.0;
            auVar5._12_4_ = 0;
            auVar5._0_12_ = ZEXT812(0);
            local_a1c = 0.0;
            local_a1d = false;
            local_a1e = false;
            local_a1f = false;
            local_a20 = false;
            local_a24 = 0;
            local_a28 = 0;
            local_a2c = 0;
            local_a30 = 0;
            if (local_c99 != false) {
              auVar5 = vroundss_avx(auVar5 << 0x20,ZEXT416((uint)local_a04),9);
              local_a34 = (int)auVar5._0_4_;
              auVar5 = vroundss_avx(auVar5,ZEXT416((uint)local_a08),9);
              local_a38 = (int)auVar5._0_4_;
              local_a3c = local_a34 + 1;
              local_a40 = local_a38 + 1;
              local_a44 = local_a04 - (float)local_a34;
              local_a48 = local_a08 - (float)local_a38;
              local_a4c = 1.0 - local_a44;
              local_a50 = 1.0 - local_a48;
              local_c9a = -1 < local_a34 && -1 < local_a38;
              local_a1d = local_c9a;
              bVar1 = local_a40 <= local_728 + -1;
              local_c9b = -1 < local_a34 && bVar1;
              local_a1e = local_c9b;
              bVar3 = local_a3c <= local_72c + -1;
              local_c9c = bVar3 && -1 < local_a38;
              local_a1f = local_c9c;
              bVar4 = local_a3c <= local_72c + -1;
              bVar2 = local_a40 <= local_728 + -1;
              local_c9d = bVar4 && bVar2;
              local_a20 = local_c9d;
              if (-1 < local_a34 && -1 < local_a38) {
                local_a24 = local_a34 * local_728 + local_a38;
              }
              if (-1 < local_a34 && bVar1) {
                local_a28 = local_a34 * local_728 + local_a40;
              }
              if (bVar3 && -1 < local_a38) {
                local_a2c = local_a3c * local_728 + local_a38;
              }
              if (bVar4 && bVar2) {
                local_a30 = local_a3c * local_728 + local_a40;
              }
              local_a10 = local_a4c * local_a50;
              local_a14 = local_a4c * local_a48;
              local_a18 = local_a44 * local_a50;
              local_a1c = local_a44 * local_a48;
            }
            for (local_a54 = 0; local_a54 < local_730; local_a54 = local_a54 + 1) {
              local_5a0 = &local_aa8;
              local_17c = local_718->w;
              local_180 = local_718->h;
              local_184 = local_718->d;
              local_a60 = (void *)((long)local_718->data +
                                  local_718->cstep * (long)local_a54 * local_718->elemsize);
              local_198 = local_718->elemsize;
              local_19c = local_718->elempack;
              local_1a8 = local_718->allocator;
              local_178 = &local_aa8;
              local_120 = (long)local_17c * (long)local_180 * local_198;
              local_124 = 0x10;
              local_5a8 = local_718;
              local_5ac = local_a54;
              local_5ad = 1;
              local_3d0 = &local_aa8;
              local_680 = &local_aa8;
              local_aa8 = 0;
              local_a98 = 0;
              local_a90 = 0;
              local_a80 = 0;
              local_a7c = 0;
              local_a78 = 0;
              local_a74 = 0;
              local_a70 = 0;
              local_a68 = 0;
              local_aa0 = 0;
              local_aac = 0.0;
              local_ab0 = 0.0;
              local_ab4 = 0.0;
              local_ab8 = 0.0;
              local_abc = 0.0;
              local_ac0 = 0.0;
              local_ac4 = 0.0;
              local_ac8 = 0.0;
              if (local_c99 != false) {
                local_acc = 0.0;
                local_ad0 = 0.0;
                local_ad4 = 0.0;
                local_ad8 = 0.0;
                local_adc = 0.0;
                local_ae0 = 0.0;
                local_ae4 = 0.0;
                local_ae8 = 0.0;
                local_aec = 0.0;
                local_af0 = 0.0;
                local_af4 = 0.0;
                local_af8 = 0.0;
                local_afc = 0.0;
                local_b00 = 0.0;
                local_b04 = 0.0;
                local_b08 = 0.0;
                local_b0c = 0.0;
                local_b10 = 0.0;
                local_b14 = 0.0;
                local_b18 = 0.0;
                local_b1c = 0.0;
                local_b20 = 0.0;
                local_b24 = 0.0;
                local_b28 = 0.0;
                local_b2c = 0.0;
                local_b30 = 0.0;
                local_b34 = 0.0;
                local_b38 = 0.0;
                local_b3c = 0.0;
                local_b40 = 0.0;
                local_b44 = 0.0;
                local_b48 = 0.0;
                if (local_a1d != false) {
                  local_acc = *(float *)((long)local_a60 + (long)(local_a24 << 3) * 4);
                  local_ad0 = *(float *)((long)local_a60 + (long)(local_a24 << 3) * 4 + 4);
                  local_ad4 = *(float *)((long)local_a60 + (long)(local_a24 << 3) * 4 + 8);
                  local_ad8 = *(float *)((long)local_a60 + (long)(local_a24 << 3) * 4 + 0xc);
                  local_adc = *(float *)((long)local_a60 + (long)(local_a24 << 3) * 4 + 0x10);
                  local_ae0 = *(float *)((long)local_a60 + (long)(local_a24 << 3) * 4 + 0x14);
                  local_ae4 = *(float *)((long)local_a60 + (long)(local_a24 << 3) * 4 + 0x18);
                  local_ae8 = *(float *)((long)local_a60 + (long)(local_a24 << 3) * 4 + 0x1c);
                }
                if (local_a1e != false) {
                  local_aec = *(float *)((long)local_a60 + (long)(local_a28 << 3) * 4);
                  local_af0 = *(float *)((long)local_a60 + (long)(local_a28 << 3) * 4 + 4);
                  local_af4 = *(float *)((long)local_a60 + (long)(local_a28 << 3) * 4 + 8);
                  local_af8 = *(float *)((long)local_a60 + (long)(local_a28 << 3) * 4 + 0xc);
                  local_afc = *(float *)((long)local_a60 + (long)(local_a28 << 3) * 4 + 0x10);
                  local_b00 = *(float *)((long)local_a60 + (long)(local_a28 << 3) * 4 + 0x14);
                  local_b04 = *(float *)((long)local_a60 + (long)(local_a28 << 3) * 4 + 0x18);
                  local_b08 = *(float *)((long)local_a60 + (long)(local_a28 << 3) * 4 + 0x1c);
                }
                if (local_a1f != false) {
                  local_b0c = *(float *)((long)local_a60 + (long)(local_a2c << 3) * 4);
                  local_b10 = *(float *)((long)local_a60 + (long)(local_a2c << 3) * 4 + 4);
                  local_b14 = *(float *)((long)local_a60 + (long)(local_a2c << 3) * 4 + 8);
                  local_b18 = *(float *)((long)local_a60 + (long)(local_a2c << 3) * 4 + 0xc);
                  local_b1c = *(float *)((long)local_a60 + (long)(local_a2c << 3) * 4 + 0x10);
                  local_b20 = *(float *)((long)local_a60 + (long)(local_a2c << 3) * 4 + 0x14);
                  local_b24 = *(float *)((long)local_a60 + (long)(local_a2c << 3) * 4 + 0x18);
                  local_b28 = *(float *)((long)local_a60 + (long)(local_a2c << 3) * 4 + 0x1c);
                }
                if (local_a20 != false) {
                  local_b2c = *(float *)((long)local_a60 + (long)(local_a30 << 3) * 4);
                  local_b30 = *(float *)((long)local_a60 + (long)(local_a30 << 3) * 4 + 4);
                  local_b34 = *(float *)((long)local_a60 + (long)(local_a30 << 3) * 4 + 8);
                  local_b38 = *(float *)((long)local_a60 + (long)(local_a30 << 3) * 4 + 0xc);
                  local_b3c = *(float *)((long)local_a60 + (long)(local_a30 << 3) * 4 + 0x10);
                  local_b40 = *(float *)((long)local_a60 + (long)(local_a30 << 3) * 4 + 0x14);
                  local_b44 = *(float *)((long)local_a60 + (long)(local_a30 << 3) * 4 + 0x18);
                  local_b48 = *(float *)((long)local_a60 + (long)(local_a30 << 3) * 4 + 0x1c);
                }
                local_aac = local_a10 * local_acc + local_a14 * local_aec + local_a18 * local_b0c +
                            local_a1c * local_b2c;
                local_ab0 = local_a10 * local_ad0 + local_a14 * local_af0 + local_a18 * local_b10 +
                            local_a1c * local_b30;
                local_ab4 = local_a10 * local_ad4 + local_a14 * local_af4 + local_a18 * local_b14 +
                            local_a1c * local_b34;
                local_ab8 = local_a10 * local_ad8 + local_a14 * local_af8 + local_a18 * local_b18 +
                            local_a1c * local_b38;
                local_abc = local_a10 * local_adc + local_a14 * local_afc + local_a18 * local_b1c +
                            local_a1c * local_b3c;
                local_ac0 = local_a10 * local_ae0 + local_a14 * local_b00 + local_a18 * local_b20 +
                            local_a1c * local_b40;
                local_ac4 = local_a10 * local_ae4 + local_a14 * local_b04 + local_a18 * local_b24 +
                            local_a1c * local_b44;
                local_ac8 = local_a10 * local_ae8 + local_a14 * local_b08 + local_a18 * local_b28 +
                            local_a1c * local_b48;
              }
              if ((local_721 & 1) != 0) {
                local_aac = local_838 * local_aac;
                local_ab0 = local_838 * local_ab0;
                local_ab4 = local_838 * local_ab4;
                local_ab8 = local_838 * local_ab8;
                local_abc = local_838 * local_abc;
                local_ac0 = local_838 * local_ac0;
                local_ac4 = local_838 * local_ac4;
                local_ac8 = local_838 * local_ac8;
              }
              local_824 = local_aac * *local_778 + local_ab0 * local_778[1] +
                          local_ab4 * local_778[2] + local_ab8 * local_778[3] +
                          local_abc * local_778[4] + local_ac0 * local_778[5] +
                          local_ac4 * local_778[6] + local_ac8 * local_778[7] + local_824;
              local_778 = local_778 + 8;
              local_658 = local_680;
              local_190 = local_a60;
              local_a88 = local_1a8;
            }
          }
        }
        local_384[0] = local_824;
        local_390 = in_stack_00000040;
        switch(in_stack_00000038) {
        case 1:
          auVar5 = vmaxss_avx(ZEXT416((uint)local_824),ZEXT816(0));
          local_384[0] = auVar5._0_4_;
          break;
        case 2:
          local_338 = in_stack_00000040;
          local_340 = 0;
          local_394 = *(float *)*in_stack_00000040;
          if (local_824 <= 0.0) {
            local_cd4 = local_824 * local_394;
          }
          else {
            local_cd4 = local_824;
          }
          local_384[0] = local_cd4;
          break;
        case 3:
          local_348 = in_stack_00000040;
          local_350 = 0;
          local_398 = *(float *)*in_stack_00000040;
          local_358 = in_stack_00000040;
          local_360 = 1;
          local_39c = *(float *)(*in_stack_00000040 + 4);
          if (local_824 < local_398) {
            local_384[0] = local_398;
          }
          if (local_39c < local_384[0]) {
            local_384[0] = local_39c;
          }
          break;
        case 4:
          local_3a0 = 88.37626;
          pfVar8 = std::min<float>(local_384,&local_3a0);
          local_384[0] = *pfVar8;
          local_3a4 = -88.37626;
          pfVar8 = std::max<float>(local_384,&local_3a4);
          local_384[0] = *pfVar8;
          fVar9 = expf(-local_384[0]);
          local_384[0] = 1.0 / (fVar9 + 1.0);
          break;
        case 5:
          fVar10 = expf(local_824);
          fVar10 = logf(fVar10 + 1.0);
          local_384[0] = tanhf(fVar10);
          local_384[0] = fVar9 * local_384[0];
          break;
        case 6:
          local_368 = in_stack_00000040;
          local_370 = 0;
          local_3a8 = *(float *)*in_stack_00000040;
          local_378 = in_stack_00000040;
          local_384[1] = 1.4013e-45;
          local_384[2] = 0.0;
          local_3ac = *(float *)(*in_stack_00000040 + 4);
          local_3b0 = -local_3ac / local_3a8;
          local_3b4 = 1.0 / local_3a8 + local_3b0;
          if (local_3b0 <= local_824) {
            if (local_824 <= local_3b4) {
              local_384[0] = local_824 * (local_824 * local_3a8 + local_3ac);
            }
          }
          else {
            local_384[0] = 0.0;
          }
        }
        *(float *)(local_7d8 + (long)(local_760 * local_734) * 4 + (long)local_764 * 4) =
             local_384[0];
      }
    }
  }
  return;
}

Assistant:

static void deformableconv2d_pack8to1_avx(const std::vector<Mat>& bottom_blobs, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int pad_left, int pad_top, int activation_type, const Mat& activation_params, const Option& opt)
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];
    const bool has_mask = (bottom_blobs.size() == 3);
    const bool offset_not_pack = offset.elempack == 1;
    const bool mask_not_pack = has_mask ? bottom_blobs[2].elempack == 1 : true;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const int size = outw * outh;
    const int maxk = kernel_w * kernel_h;

    const float* bias_data_ptr = bias_data;
    const int elempack = 8;
    const int out_elempack = 1;
    const int wstep = out_elempack * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < outh; h_col++)
    {
        for (int w_col = 0; w_col < outw; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            for (int oc = 0; oc < outch; oc++)
            {
                const float* kptr = weight_data_packed.channel(oc);
                float* outptr = top_blob.channel(oc);
                float _sum = 0.f;
                if (bias_data_ptr)
                    _sum = *(bias_data_ptr + oc);
                for (int i = 0; i < kernel_h; i++)
                {
                    for (int j = 0; j < kernel_w; j++)
                    {
                        float offset_h = 0.f;
                        float offset_w = 0.f;
                        float mask_ = 1.f;
                        if (offset_not_pack)
                        {
                            offset_h = offset.channel((i * kernel_w + j) * 2).row(h_col)[w_col];
                            offset_w = offset.channel((i * kernel_w + j) * 2 + 1).row(h_col)[w_col];
                        }
                        else
                        {
                            const int y_c = (i * kernel_w + j) * 2;
                            const int x_c = (i * kernel_w + j) * 2 + 1;
                            offset_h = offset.channel(y_c / offset.elempack).row(h_col)[w_col * offset.elempack + y_c % offset.elempack];
                            offset_w = offset.channel(x_c / offset.elempack).row(h_col)[w_col * offset.elempack + x_c % offset.elempack];
                        }
                        if (has_mask)
                        {
                            const Mat& mask = bottom_blobs[2];
                            if (mask_not_pack)
                            {
                                mask_ = mask.channel(i * kernel_w + j).row(h_col)[w_col];
                            }
                            else
                            {
                                const int m_c = i * kernel_w + j;
                                mask_ = mask.channel(m_c / mask.elempack).row(h_col)[w_col * mask.elempack + m_c % mask.elempack];
                            }
                        }
                        const float h_im = h_in + i * dilation_h + offset_h;
                        const float w_im = w_in + j * dilation_w + offset_w;

                        // Bilinear
                        const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                        float w1 = 0.f;
                        float w2 = 0.f;
                        float w3 = 0.f;
                        float w4 = 0.f;
                        bool v1_cond = false;
                        bool v2_cond = false;
                        bool v3_cond = false;
                        bool v4_cond = false;
                        int v1_pos = 0;
                        int v2_pos = 0;
                        int v3_pos = 0;
                        int v4_pos = 0;
                        if (cond)
                        {
                            int h_low = (int)floorf(h_im);
                            int w_low = (int)floorf(w_im);
                            int h_high = h_low + 1;
                            int w_high = w_low + 1;

                            float lh = h_im - h_low;
                            float lw = w_im - w_low;
                            float hh = 1 - lh;
                            float hw = 1 - lw;

                            v1_cond = (h_low >= 0 && w_low >= 0);
                            v2_cond = (h_low >= 0 && w_high <= w - 1);
                            v3_cond = (h_high <= h - 1 && w_low >= 0);
                            v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                            if (v1_cond)
                                v1_pos = h_low * w + w_low;
                            if (v2_cond)
                                v2_pos = h_low * w + w_high;
                            if (v3_cond)
                                v3_pos = h_high * w + w_low;
                            if (v4_cond)
                                v4_pos = h_high * w + w_high;

                            w1 = hh * hw;
                            w2 = hh * lw;
                            w3 = lh * hw;
                            w4 = lh * lw;
                        }

                        for (int ic = 0; ic < inch; ic++)
                        {
                            const float* data_im_ptr = bottom_blob.channel(ic);
                            float _val_channel0 = 0.f;
                            float _val_channel1 = _val_channel0;
                            float _val_channel2 = _val_channel0;
                            float _val_channel3 = _val_channel0;
                            float _val_channel4 = _val_channel0;
                            float _val_channel5 = _val_channel0;
                            float _val_channel6 = _val_channel0;
                            float _val_channel7 = _val_channel0;
                            if (cond)
                            {
                                float _v1_channel0 = _val_channel0;
                                float _v1_channel1 = _val_channel0;
                                float _v1_channel2 = _val_channel0;
                                float _v1_channel3 = _val_channel0;
                                float _v1_channel4 = _val_channel0;
                                float _v1_channel5 = _val_channel0;
                                float _v1_channel6 = _val_channel0;
                                float _v1_channel7 = _val_channel0;
                                float _v2_channel0 = _val_channel0;
                                float _v2_channel1 = _val_channel0;
                                float _v2_channel2 = _val_channel0;
                                float _v2_channel3 = _val_channel0;
                                float _v2_channel4 = _val_channel0;
                                float _v2_channel5 = _val_channel0;
                                float _v2_channel6 = _val_channel0;
                                float _v2_channel7 = _val_channel0;
                                float _v3_channel0 = _val_channel0;
                                float _v3_channel1 = _val_channel0;
                                float _v3_channel2 = _val_channel0;
                                float _v3_channel3 = _val_channel0;
                                float _v3_channel4 = _val_channel0;
                                float _v3_channel5 = _val_channel0;
                                float _v3_channel6 = _val_channel0;
                                float _v3_channel7 = _val_channel0;
                                float _v4_channel0 = _val_channel0;
                                float _v4_channel1 = _val_channel0;
                                float _v4_channel2 = _val_channel0;
                                float _v4_channel3 = _val_channel0;
                                float _v4_channel4 = _val_channel0;
                                float _v4_channel5 = _val_channel0;
                                float _v4_channel6 = _val_channel0;
                                float _v4_channel7 = _val_channel0;
                                if (v1_cond)
                                {
                                    _v1_channel0 = *(data_im_ptr + v1_pos * elempack);
                                    _v1_channel1 = *(data_im_ptr + v1_pos * elempack + 1);
                                    _v1_channel2 = *(data_im_ptr + v1_pos * elempack + 2);
                                    _v1_channel3 = *(data_im_ptr + v1_pos * elempack + 3);
                                    _v1_channel4 = *(data_im_ptr + v1_pos * elempack + 4);
                                    _v1_channel5 = *(data_im_ptr + v1_pos * elempack + 5);
                                    _v1_channel6 = *(data_im_ptr + v1_pos * elempack + 6);
                                    _v1_channel7 = *(data_im_ptr + v1_pos * elempack + 7);
                                }
                                if (v2_cond)
                                {
                                    _v2_channel0 = *(data_im_ptr + v2_pos * elempack);
                                    _v2_channel1 = *(data_im_ptr + v2_pos * elempack + 1);
                                    _v2_channel2 = *(data_im_ptr + v2_pos * elempack + 2);
                                    _v2_channel3 = *(data_im_ptr + v2_pos * elempack + 3);
                                    _v2_channel4 = *(data_im_ptr + v2_pos * elempack + 4);
                                    _v2_channel5 = *(data_im_ptr + v2_pos * elempack + 5);
                                    _v2_channel6 = *(data_im_ptr + v2_pos * elempack + 6);
                                    _v2_channel7 = *(data_im_ptr + v2_pos * elempack + 7);
                                }
                                if (v3_cond)
                                {
                                    _v3_channel0 = *(data_im_ptr + v3_pos * elempack);
                                    _v3_channel1 = *(data_im_ptr + v3_pos * elempack + 1);
                                    _v3_channel2 = *(data_im_ptr + v3_pos * elempack + 2);
                                    _v3_channel3 = *(data_im_ptr + v3_pos * elempack + 3);
                                    _v3_channel4 = *(data_im_ptr + v3_pos * elempack + 4);
                                    _v3_channel5 = *(data_im_ptr + v3_pos * elempack + 5);
                                    _v3_channel6 = *(data_im_ptr + v3_pos * elempack + 6);
                                    _v3_channel7 = *(data_im_ptr + v3_pos * elempack + 7);
                                }
                                if (v4_cond)
                                {
                                    _v4_channel0 = *(data_im_ptr + v4_pos * elempack);
                                    _v4_channel1 = *(data_im_ptr + v4_pos * elempack + 1);
                                    _v4_channel2 = *(data_im_ptr + v4_pos * elempack + 2);
                                    _v4_channel3 = *(data_im_ptr + v4_pos * elempack + 3);
                                    _v4_channel4 = *(data_im_ptr + v4_pos * elempack + 4);
                                    _v4_channel5 = *(data_im_ptr + v4_pos * elempack + 5);
                                    _v4_channel6 = *(data_im_ptr + v4_pos * elempack + 6);
                                    _v4_channel7 = *(data_im_ptr + v4_pos * elempack + 7);
                                }
                                _val_channel0 = w1 * _v1_channel0 + w2 * _v2_channel0 + w3 * _v3_channel0 + w4 * _v4_channel0;
                                _val_channel1 = w1 * _v1_channel1 + w2 * _v2_channel1 + w3 * _v3_channel1 + w4 * _v4_channel1;
                                _val_channel2 = w1 * _v1_channel2 + w2 * _v2_channel2 + w3 * _v3_channel2 + w4 * _v4_channel2;
                                _val_channel3 = w1 * _v1_channel3 + w2 * _v2_channel3 + w3 * _v3_channel3 + w4 * _v4_channel3;
                                _val_channel4 = w1 * _v1_channel4 + w2 * _v2_channel4 + w3 * _v3_channel4 + w4 * _v4_channel4;
                                _val_channel5 = w1 * _v1_channel5 + w2 * _v2_channel5 + w3 * _v3_channel5 + w4 * _v4_channel5;
                                _val_channel6 = w1 * _v1_channel6 + w2 * _v2_channel6 + w3 * _v3_channel6 + w4 * _v4_channel6;
                                _val_channel7 = w1 * _v1_channel7 + w2 * _v2_channel7 + w3 * _v3_channel7 + w4 * _v4_channel7;
                            }
                            if (has_mask)
                            {
                                _val_channel0 *= mask_;
                                _val_channel1 *= mask_;
                                _val_channel2 *= mask_;
                                _val_channel3 *= mask_;
                                _val_channel4 *= mask_;
                                _val_channel5 *= mask_;
                                _val_channel6 *= mask_;
                                _val_channel7 *= mask_;
                            }
                            float _conv_w0 = *(kptr);
                            float _conv_w1 = *(kptr + out_elempack); // 1 * out_elempack
                            float _conv_w2 = *(kptr + 2);            // 2 * out_elempack
                            float _conv_w3 = *(kptr + 3);            // 3 * out_elempack
                            float _conv_w4 = *(kptr + 4);            // 4 * out_elempack
                            float _conv_w5 = *(kptr + 5);            // 5 * out_elempack
                            float _conv_w6 = *(kptr + 6);            // 6 * out_elempack
                            float _conv_w7 = *(kptr + 7);            // 7 * out_elempack
                            _sum += (_val_channel0 * _conv_w0 + _val_channel1 * _conv_w1 + _val_channel2 * _conv_w2 + _val_channel3 * _conv_w3 + _val_channel4 * _conv_w4 + _val_channel5 * _conv_w5 + _val_channel6 * _conv_w6 + _val_channel7 * _conv_w7);
                            kptr += wstep;
                        }
                    }
                }
                _sum = activation_ss(_sum, activation_type, activation_params);
                *(outptr + h_col * outw + w_col) = _sum;
            }
        }
    }
}